

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void dataDeviceHandleSelection(void *userData,wl_data_device *device,wl_data_offer *offer)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  wl_data_offer *pwVar4;
  long lVar5;
  
  if (_glfw.wl.selectionOffer != (wl_data_offer *)0x0) {
    wl_data_offer_destroy(_glfw.wl.selectionOffer);
    _glfw.wl.selectionOffer = (wl_data_offer *)0x0;
  }
  lVar3 = 0;
  do {
    lVar5 = lVar3;
    if ((ulong)_glfw.wl.offerCount * 0x10 + 0x10 == lVar5 + 0x10) {
      return;
    }
    lVar3 = lVar5 + 0x10;
  } while (*(wl_data_offer **)((long)&(_glfw.wl.offers)->offer + lVar5) != offer);
  pwVar4 = offer;
  if (*(int *)((long)&(_glfw.wl.offers)->text_plain_utf8 + lVar5) == 0) {
    wl_data_offer_destroy(offer);
    pwVar4 = _glfw.wl.selectionOffer;
  }
  _glfw.wl.selectionOffer = pwVar4;
  uVar2 = *(undefined8 *)&_glfw.wl.offers[_glfw.wl.offerCount - 1].text_plain_utf8;
  puVar1 = (undefined8 *)((long)&(_glfw.wl.offers)->offer + lVar5);
  *puVar1 = _glfw.wl.offers[_glfw.wl.offerCount - 1].offer;
  puVar1[1] = uVar2;
  _glfw.wl.offerCount = _glfw.wl.offerCount - 1;
  return;
}

Assistant:

static void dataDeviceHandleSelection(void* userData,
                                      struct wl_data_device* device,
                                      struct wl_data_offer* offer)
{
    if (_glfw.wl.selectionOffer)
    {
        wl_data_offer_destroy(_glfw.wl.selectionOffer);
        _glfw.wl.selectionOffer = NULL;
    }

    for (unsigned int i = 0; i < _glfw.wl.offerCount; i++)
    {
        if (_glfw.wl.offers[i].offer == offer)
        {
            if (_glfw.wl.offers[i].text_plain_utf8)
                _glfw.wl.selectionOffer = offer;
            else
                wl_data_offer_destroy(offer);

            _glfw.wl.offers[i] = _glfw.wl.offers[_glfw.wl.offerCount - 1];
            _glfw.wl.offerCount--;
            break;
        }
    }
}